

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_star_expression.cpp
# Opt level: O2

StarExpressionType __thiscall
duckdb::Binder::FindStarExpression
          (Binder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,StarExpression **star,bool is_root,bool in_columns)

{
  ExpressionType EVar1;
  StarExpression *pSVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  pointer puVar5;
  StarExpressionType SVar6;
  bool bVar7;
  int iVar8;
  pointer pPVar9;
  BaseExpression *pBVar10;
  OperatorExpression *pOVar11;
  reference expr_00;
  BinderException *pBVar12;
  StarExpression *expr_01;
  type pPVar13;
  duckdb *this_00;
  ParsedExpression *expr_02;
  pointer this_01;
  StarExpressionType has_star;
  bool in_columns_local;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_f0;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  star_list;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  StarExpression **star_local;
  vector<duckdb::Value,_true> values;
  vector<duckdb::Value,_true> local_60;
  LogicalType local_48;
  
  has_star = NONE;
  in_columns_local = in_columns;
  star_local = star;
  pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(expr);
  EVar1 = (pPVar9->super_BaseExpression).type;
  pBVar10 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(expr)->super_BaseExpression;
  if (EVar1 == OPERATOR_UNPACK) {
    pOVar11 = BaseExpression::Cast<duckdb::OperatorExpression>(pBVar10);
    expr_00 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(&pOVar11->children,0);
    SVar6 = FindStarExpression(this,expr_00,star,is_root,in_columns);
    if (SVar6 < UNPACKED) {
      return UNPACKED;
    }
    pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_c8._M_pod_data,
               "UNPACK can only be used in combination with a STAR (*) expression or COLUMNS expression"
               ,(allocator *)&star_list);
    BinderException::BinderException(pBVar12,(string *)&local_c8);
    __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (pBVar10->expression_class == STAR) {
    pBVar10 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(expr)->super_BaseExpression;
    expr_01 = BaseExpression::Cast<duckdb::StarExpression>(pBVar10);
    pPVar13 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(expr);
    bVar7 = StarExpression::IsStar(pPVar13);
    if (bVar7) {
      if (is_root) {
        *star = expr_01;
      }
      else {
        if (!in_columns) {
          pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)local_c8._M_pod_data,
                     "STAR expression is only allowed as the root element of an expression. Use COLUMNS(*) instead."
                     ,(allocator *)&star_list);
          BinderException::BinderException(pBVar12,(string *)&local_c8);
          __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((expr_01->replace_list)._M_h._M_element_count != 0) {
          pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)local_c8._M_pod_data,
                     "STAR expression with REPLACE list is only allowed as the root element of COLUMNS"
                     ,(allocator *)&star_list);
          BinderException::BinderException(pBVar12,(string *)&local_c8);
          __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((expr_01->rename_list)._M_h._M_element_count != 0) {
          pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)local_c8._M_pod_data,
                     "STAR expression with RENAME list is only allowed as the root element of COLUMNS"
                     ,(allocator *)&star_list);
          BinderException::BinderException(pBVar12,(string *)&local_c8);
          __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        star_list.
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        star_list.
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        star_list.
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        BindContext::GenerateAllColumnExpressions(&this->bind_context,expr_01,&star_list);
        values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::reserve
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&values,
                   (long)star_list.
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)star_list.
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        puVar5 = star_list.
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_01 = star_list.
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar5;
            this_01 = this_01 + 1) {
          this_00 = (duckdb *)
                    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(this_01);
          GetColumnsStringValue_abi_cxx11_((string *)&local_c8,this_00,expr_02);
          ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
          emplace_back<std::__cxx11::string>
                    ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&values,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8)
          ;
          ::std::__cxx11::string::~string((string *)local_c8._M_pod_data);
        }
        LogicalType::LogicalType(&local_48,VARCHAR);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_60,
                   &values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
        Value::LIST((Value *)&local_c8,&local_48,&local_60);
        make_uniq<duckdb::ConstantExpression,duckdb::Value>((duckdb *)&local_f0,(Value *)&local_c8);
        _Var4._M_head_impl = local_f0._M_head_impl;
        local_f0._M_head_impl = (ParsedExpression *)0x0;
        _Var3._M_head_impl =
             (expr->
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (expr->
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var4._M_head_impl;
        if ((_Var3._M_head_impl != (ParsedExpression *)0x0) &&
           ((**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))(),
           local_f0._M_head_impl != (ParsedExpression *)0x0)) {
          (**(code **)(*(long *)local_f0._M_head_impl + 8))();
        }
        local_f0._M_head_impl = (ParsedExpression *)0x0;
        Value::~Value((Value *)&local_c8);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_60);
        LogicalType::~LogicalType(&local_48);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&values);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector(&star_list.
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 );
      }
    }
    else {
      if (in_columns) {
        pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_c8._M_pod_data,
                   "COLUMNS expression is not allowed inside another COLUMNS expression",
                   (allocator *)&star_list);
        BinderException::BinderException(pBVar12,(string *)&local_c8);
        __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      in_columns_local = true;
      pSVar2 = *star;
      if (pSVar2 == (StarExpression *)0x0) {
        *star = expr_01;
        has_star = STAR;
        goto LAB_005ce6d6;
      }
      iVar8 = (*(pSVar2->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[10])
                        (pSVar2,expr_01);
      if ((char)iVar8 == '\0') {
        pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
        pPVar13 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(expr);
        ::std::__cxx11::string::string
                  ((string *)local_c8._M_pod_data,
                   "Multiple different STAR/COLUMNS in the same expression are not supported",
                   (allocator *)&star_list);
        BinderException::BinderException<>(pBVar12,pPVar13,(string *)&local_c8);
        __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    has_star = STAR;
  }
  else {
LAB_005ce6d6:
    pPVar13 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(expr);
    local_b8 = (code *)0x0;
    pcStack_b0 = (code *)0x0;
    local_c8._M_unused._M_object = (void *)0x0;
    local_c8._8_8_ = 0;
    local_c8._M_unused._M_object = operator_new(0x20);
    *(Binder **)local_c8._M_unused._0_8_ = this;
    *(StarExpression ****)((long)local_c8._M_unused._0_8_ + 8) = &star_local;
    *(bool **)((long)local_c8._M_unused._0_8_ + 0x10) = &in_columns_local;
    *(StarExpressionType **)((long)local_c8._M_unused._0_8_ + 0x18) = &has_star;
    pcStack_b0 = ::std::
                 _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_star_expression.cpp:91:53)>
                 ::_M_invoke;
    local_b8 = ::std::
               _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_star_expression.cpp:91:53)>
               ::_M_manager;
    ParsedExpressionIterator::EnumerateChildren
              (pPVar13,(function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                        *)&local_c8);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  }
  return has_star;
}

Assistant:

StarExpressionType Binder::FindStarExpression(unique_ptr<ParsedExpression> &expr, StarExpression **star, bool is_root,
                                              bool in_columns) {
	StarExpressionType has_star = StarExpressionType::NONE;
	if (expr->GetExpressionType() == ExpressionType::OPERATOR_UNPACK) {
		auto &operator_expr = expr->Cast<OperatorExpression>();
		auto res = FindStarExpression(operator_expr.children[0], star, is_root, in_columns);
		if (res != StarExpressionType::STAR && res != StarExpressionType::COLUMNS) {
			throw BinderException(
			    "UNPACK can only be used in combination with a STAR (*) expression or COLUMNS expression");
		}
		return StarExpressionType::UNPACKED;
	}
	if (expr->GetExpressionClass() == ExpressionClass::STAR) {
		auto &current_star = expr->Cast<StarExpression>();
		if (StarExpression::IsStar(*expr)) {
			if (is_root) {
				D_ASSERT(!in_columns);
				// At the root level
				*star = &current_star;
				return StarExpressionType::STAR;
			}

			if (!in_columns) {
				// '*' can only appear inside COLUMNS or at the root level
				throw BinderException(
				    "STAR expression is only allowed as the root element of an expression. Use COLUMNS(*) instead.");
			}

			if (!current_star.replace_list.empty()) {
				// '*' inside COLUMNS can not have a REPLACE list
				throw BinderException(
				    "STAR expression with REPLACE list is only allowed as the root element of COLUMNS");
			}
			if (!current_star.rename_list.empty()) {
				// '*' inside COLUMNS can not have a REPLACE list
				throw BinderException(
				    "STAR expression with RENAME list is only allowed as the root element of COLUMNS");
			}

			// '*' expression inside a COLUMNS - convert to a constant list of strings (column names)
			vector<unique_ptr<ParsedExpression>> star_list;
			bind_context.GenerateAllColumnExpressions(current_star, star_list);

			vector<Value> values;
			values.reserve(star_list.size());
			for (auto &element : star_list) {
				values.emplace_back(GetColumnsStringValue(*element));
			}
			D_ASSERT(!values.empty());
			expr = make_uniq<ConstantExpression>(Value::LIST(LogicalType::VARCHAR, values));
			return StarExpressionType::STAR;
		}
		if (in_columns) {
			throw BinderException("COLUMNS expression is not allowed inside another COLUMNS expression");
		}
		in_columns = true;

		if (*star) {
			// we can have multiple
			if (!(*star)->Equals(current_star)) {
				throw BinderException(*expr,
				                      "Multiple different STAR/COLUMNS in the same expression are not supported");
			}
			return StarExpressionType::STAR;
		}
		*star = &current_star;
		has_star = StarExpressionType::STAR;
	}
	ParsedExpressionIterator::EnumerateChildren(*expr, [&](unique_ptr<ParsedExpression> &child_expr) {
		auto res = FindStarExpression(child_expr, star, false, in_columns);
		if (res != StarExpressionType::NONE) {
			has_star = res;
		}
	});
	return has_star;
}